

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

void __thiscall
chaiscript::exception::file_not_found_error::file_not_found_error
          (file_not_found_error *this,string *t_filename)

{
  runtime_error *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  char *in_stack_00000018;
  string local_30 [48];
  
  std::operator+(in_stack_00000018,in_stack_00000010);
  std::runtime_error::runtime_error(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  *(undefined ***)in_RDI = &PTR__file_not_found_error_005cf2e8;
  return;
}

Assistant:

file_not_found_error(const std::string &t_filename) CHAISCRIPT_NOEXCEPT
        : std::runtime_error("File Not Found: " + t_filename)
      { }